

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-constant.h
# Opt level: O3

void __thiscall
wasm::PossibleConstantValues::note(PossibleConstantValues *this,Expression *expr,Module *wasm)

{
  Id IVar1;
  Id IVar2;
  Expression *pEVar3;
  uintptr_t uVar4;
  Global *pGVar5;
  uintptr_t uVar6;
  int *piVar7;
  uint uVar8;
  Literal local_40;
  Many local_21;
  
  IVar1 = expr->_id;
  IVar2 = IVar1;
  pEVar3 = expr;
  while (IVar2 == RefAsId) {
    if (1 < pEVar3[1]._id - BlockId) goto LAB_0061d8f8;
    pEVar3 = (Expression *)pEVar3[1].type.id;
    IVar2 = pEVar3->_id;
  }
  if ((IVar2 - ConstId < 0x3d) &&
     ((0x1000000028000001U >> ((ulong)(IVar2 - ConstId) & 0x3f) & 1) != 0)) {
LAB_0061d8d0:
    Properties::getLiteral(&local_40,expr);
    note<wasm::Literal>(this,&local_40);
    Literal::~Literal(&local_40);
  }
  else {
LAB_0061d8f8:
    if (IVar1 == GlobalGetId) {
      pGVar5 = Module::getGlobal(wasm,(Name)expr[1]);
      if (pGVar5->mutable_ == false) {
        note<wasm::Name>(this,(Name)expr[1]);
        return;
      }
    }
    else if (IVar1 == TupleMakeId) {
      uVar4 = expr[1].type.id;
      if (uVar4 != 0) {
        uVar6 = 0;
        do {
          for (piVar7 = *(int **)(*(long *)(expr + 1) + uVar6 * 8); *piVar7 == 0x48;
              piVar7 = *(int **)(piVar7 + 6)) {
            if (1 < piVar7[4] - 1U) goto LAB_0061d971;
          }
          uVar8 = *piVar7 - 0xe;
          if ((0x3c < uVar8) || ((0x1000000028000001U >> ((ulong)uVar8 & 0x3f) & 1) == 0))
          goto LAB_0061d971;
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar4);
      }
      goto LAB_0061d8d0;
    }
LAB_0061d971:
    std::
    variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
    ::operator=((variant<wasm::PossibleConstantValues::None,wasm::Literal,wasm::Name,wasm::PossibleConstantValues::Many>
                 *)this,&local_21);
  }
  return;
}

Assistant:

void note(Expression* expr, Module& wasm) {
    // If this is a constant literal value, note that.
    if (Properties::isConstantExpression(expr)) {
      note(Properties::getLiteral(expr));
      return;
    }

    // If this is an immutable global that we get, note that.
    if (auto* get = expr->dynCast<GlobalGet>()) {
      auto* global = wasm.getGlobal(get->name);
      if (global->mutable_ == Immutable) {
        note(get->name);
        return;
      }
    }

    // Otherwise, this is not something we can reason about.
    noteUnknown();
  }